

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall
Catch::ReporterRegistry::registerReporter
          (ReporterRegistry *this,string *name,IReporterFactory *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>
  local_48;
  
  paVar1 = &local_48.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  local_48.second = factory;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IReporterFactory*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IReporterFactory*>>>
              *)&this->m_factories,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void registerReporter( std::string const& name, IReporterFactory* factory ) {
            m_factories.insert( std::make_pair( name, factory ) );
        }